

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O2

void __thiscall
transaction_tests::basic_transaction_tests::test_method(basic_transaction_tests *this)

{
  long lVar1;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  Span<const_std::byte> sp;
  const_string file;
  const_string file_00;
  check_type cVar5;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  lazy_ostream local_2c8;
  undefined1 *local_2b8;
  char *local_2b0;
  assertion_result local_2a8;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  CMutableTransaction tx;
  DataStream stream;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vch;
  CTransaction local_200;
  TxValidationState state;
  uchar ch [260];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(ch,&DAT_00c3f150,0x104);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&vch,ch,ch + 0x103,
             (allocator_type *)&local_200);
  sp.m_size = (long)vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
  sp.m_data = vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
  DataStream::DataStream(&stream,sp);
  CMutableTransaction::CMutableTransaction(&tx);
  local_200.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&::TX_WITH_WITNESS;
  local_200.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&tx;
  ParamsWrapper<TransactionSerParams,_CMutableTransaction>::Unserialize<DataStream>
            ((ParamsWrapper<TransactionSerParams,_CMutableTransaction> *)&local_200,&stream);
  state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2;
  state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
  state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
  state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_local_buf[0] = '\0';
  state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<TxValidationResult>.m_debug_message.field_2;
  state.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length = 0;
  state.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x1a2;
  file.m_begin = (iterator)&local_280;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_290,msg);
  CTransaction::CTransaction(&local_200,&tx);
  bVar2 = CheckTransaction(&local_200,&state);
  local_2a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (bVar2 && state.super_ValidationState<TxValidationResult>.m_mode == M_VALID);
  local_2a8.m_message.px = (element_type *)0x0;
  local_2a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2c8.m_empty = false;
  local_2c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113afd0;
  local_2b8 = boost::unit_test::lazy_ostream::inst;
  local_2b0 = "Simple deserialized transaction should be valid.";
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_2d0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_2a8,&local_2c8,1,1,WARN,_cVar5,(size_t)&local_2d8,0x1a2);
  boost::detail::shared_count::~shared_count(&local_2a8.m_message.pn);
  CTransaction::~CTransaction(&local_200);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::push_back
            (&tx.vin,tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start);
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  file_00.m_end = (iterator)0x1a6;
  file_00.m_begin = (iterator)&local_2e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2f8,
             msg_00);
  CTransaction::CTransaction(&local_200,&tx);
  bVar2 = CheckTransaction(&local_200,&state);
  local_2a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (!bVar2 || state.super_ValidationState<TxValidationResult>.m_mode != M_VALID);
  local_2a8.m_message.px = (element_type *)0x0;
  local_2a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2c8.m_empty = false;
  local_2c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113e5b0;
  local_2b8 = boost::unit_test::lazy_ostream::inst;
  local_2b0 = "Transaction with duplicate txins should be invalid.";
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_300 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_2a8,&local_2c8,1,1,WARN,_cVar5,(size_t)&local_308,0x1a6);
  boost::detail::shared_count::~shared_count(&local_2a8.m_message.pn);
  CTransaction::~CTransaction(&local_200);
  ValidationState<TxValidationResult>::~ValidationState
            (&state.super_ValidationState<TxValidationResult>);
  CMutableTransaction::~CMutableTransaction(&tx);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(basic_transaction_tests)
{
    // Random real transaction (e2769b09e784f32f62ef849763d4f45b98e07ba658647343b915ff832b110436)
    unsigned char ch[] = {0x01, 0x00, 0x00, 0x00, 0x01, 0x6b, 0xff, 0x7f, 0xcd, 0x4f, 0x85, 0x65, 0xef, 0x40, 0x6d, 0xd5, 0xd6, 0x3d, 0x4f, 0xf9, 0x4f, 0x31, 0x8f, 0xe8, 0x20, 0x27, 0xfd, 0x4d, 0xc4, 0x51, 0xb0, 0x44, 0x74, 0x01, 0x9f, 0x74, 0xb4, 0x00, 0x00, 0x00, 0x00, 0x8c, 0x49, 0x30, 0x46, 0x02, 0x21, 0x00, 0xda, 0x0d, 0xc6, 0xae, 0xce, 0xfe, 0x1e, 0x06, 0xef, 0xdf, 0x05, 0x77, 0x37, 0x57, 0xde, 0xb1, 0x68, 0x82, 0x09, 0x30, 0xe3, 0xb0, 0xd0, 0x3f, 0x46, 0xf5, 0xfc, 0xf1, 0x50, 0xbf, 0x99, 0x0c, 0x02, 0x21, 0x00, 0xd2, 0x5b, 0x5c, 0x87, 0x04, 0x00, 0x76, 0xe4, 0xf2, 0x53, 0xf8, 0x26, 0x2e, 0x76, 0x3e, 0x2d, 0xd5, 0x1e, 0x7f, 0xf0, 0xbe, 0x15, 0x77, 0x27, 0xc4, 0xbc, 0x42, 0x80, 0x7f, 0x17, 0xbd, 0x39, 0x01, 0x41, 0x04, 0xe6, 0xc2, 0x6e, 0xf6, 0x7d, 0xc6, 0x10, 0xd2, 0xcd, 0x19, 0x24, 0x84, 0x78, 0x9a, 0x6c, 0xf9, 0xae, 0xa9, 0x93, 0x0b, 0x94, 0x4b, 0x7e, 0x2d, 0xb5, 0x34, 0x2b, 0x9d, 0x9e, 0x5b, 0x9f, 0xf7, 0x9a, 0xff, 0x9a, 0x2e, 0xe1, 0x97, 0x8d, 0xd7, 0xfd, 0x01, 0xdf, 0xc5, 0x22, 0xee, 0x02, 0x28, 0x3d, 0x3b, 0x06, 0xa9, 0xd0, 0x3a, 0xcf, 0x80, 0x96, 0x96, 0x8d, 0x7d, 0xbb, 0x0f, 0x91, 0x78, 0xff, 0xff, 0xff, 0xff, 0x02, 0x8b, 0xa7, 0x94, 0x0e, 0x00, 0x00, 0x00, 0x00, 0x19, 0x76, 0xa9, 0x14, 0xba, 0xde, 0xec, 0xfd, 0xef, 0x05, 0x07, 0x24, 0x7f, 0xc8, 0xf7, 0x42, 0x41, 0xd7, 0x3b, 0xc0, 0x39, 0x97, 0x2d, 0x7b, 0x88, 0xac, 0x40, 0x94, 0xa8, 0x02, 0x00, 0x00, 0x00, 0x00, 0x19, 0x76, 0xa9, 0x14, 0xc1, 0x09, 0x32, 0x48, 0x3f, 0xec, 0x93, 0xed, 0x51, 0xf5, 0xfe, 0x95, 0xe7, 0x25, 0x59, 0xf2, 0xcc, 0x70, 0x43, 0xf9, 0x88, 0xac, 0x00, 0x00, 0x00, 0x00, 0x00};
    std::vector<unsigned char> vch(ch, ch + sizeof(ch) -1);
    DataStream stream(vch);
    CMutableTransaction tx;
    stream >> TX_WITH_WITNESS(tx);
    TxValidationState state;
    BOOST_CHECK_MESSAGE(CheckTransaction(CTransaction(tx), state) && state.IsValid(), "Simple deserialized transaction should be valid.");

    // Check that duplicate txins fail
    tx.vin.push_back(tx.vin[0]);
    BOOST_CHECK_MESSAGE(!CheckTransaction(CTransaction(tx), state) || !state.IsValid(), "Transaction with duplicate txins should be invalid.");
}